

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double add_regularization<sparse_parameters>
                 (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  __node_base *p_Var3;
  weight *pwVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  
  pwVar4 = b->regularizers;
  p_Var3 = &(weights->_map)._M_h._M_before_begin;
  if (pwVar4 == (weight *)0x0) {
    dVar7 = 0.0;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
      *(float *)((long)&p_Var1->_M_nxt + 4) =
           *(float *)&p_Var1->_M_nxt * regularization + *(float *)((long)&p_Var1->_M_nxt + 4);
      dVar9 = (double)*(float *)&(*(_Hash_node_base **)
                                   &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)->
                                 _M_nxt;
      dVar7 = dVar7 + (double)regularization * 0.5 * dVar9 * dVar9;
    }
  }
  else {
    dVar7 = 0.0;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
      uVar5 = (ulong)p_Var3[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
      fVar8 = *(float *)&p_Var1->_M_nxt - pwVar4[uVar5 * 2 + 1];
      *(float *)((long)&p_Var1->_M_nxt + 4) =
           pwVar4[uVar5 * 2] * fVar8 + *(float *)((long)&p_Var1->_M_nxt + 4);
      pwVar4 = b->regularizers;
      dVar9 = (double)fVar8;
      dVar7 = dVar7 + (double)pwVar4[uVar5 * 2] * 0.5 * dVar9 * dVar9;
    }
  }
  if (all->no_bias == true) {
    if (b->regularizers == (weight *)0x0) {
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      fVar8 = *pwVar4;
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      pwVar4[1] = pwVar4[1] - regularization * fVar8;
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      fVar8 = *pwVar4;
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      dVar10 = (double)*pwVar4;
      dVar9 = (double)regularization * -0.5 * (double)fVar8;
    }
    else {
      uVar2 = weights->_stride_shift;
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      uVar5 = (ulong)(uint)((int)(0xb1c55cL >> ((byte)uVar2 & 0x3f)) << 3);
      fVar6 = *pwVar4 - *(float *)((long)b->regularizers + uVar5 + 4);
      fVar8 = *(float *)((long)b->regularizers + uVar5);
      pwVar4 = sparse_parameters::strided_index(weights,0xb1c55c);
      pwVar4[1] = pwVar4[1] - fVar8 * fVar6;
      dVar10 = (double)fVar6;
      dVar9 = (double)*(float *)((long)b->regularizers + uVar5) * -0.5 * dVar10;
    }
    dVar7 = dVar9 * dVar10 + dVar7;
  }
  return dVar7;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}